

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordering.hpp
# Opt level: O1

Result __thiscall
Kernel::LiteralOrdering<Kernel::LAKBO>::compare
          (LiteralOrdering<Kernel::LAKBO> *this,Literal *l1,Literal *l2)

{
  Result RVar1;
  Option<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
  atoms2;
  Option<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
  atoms1;
  _ElementType in_stack_00000200;
  _ElementType in_stack_00000218;
  Literal *local_b0;
  Literal *local_a8;
  LiteralOrdering<Kernel::LAKBO> *local_a0;
  Literal **ppLStack_98;
  Literal **local_90;
  OptionBase<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
  *local_88;
  OptionBase<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
  *pOStack_80;
  LiteralOrdering<Kernel::LAKBO> *local_78;
  OptionBase<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
  local_70;
  OptionBase<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
  local_48;
  
  local_b0 = l2;
  local_a8 = l1;
  atoms((Option<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
         *)&local_48,this,l1);
  atoms((Option<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
         *)&local_70,this,local_b0);
  if (local_48._isSome == false) {
    RVar1 = GREATER;
    if (local_70._isSome != false) goto LAB_005756a0;
  }
  else {
    RVar1 = LESS;
    if (local_70._isSome != true) goto LAB_005756a0;
    if (local_48._isSome != false) {
      ppLStack_98 = &local_a8;
      local_90 = &local_b0;
      local_a0 = this;
      local_88 = &local_48;
      pOStack_80 = &local_70;
      local_78 = this;
      RVar1 = AlascaOrderingUtils::
              lexLazy<Kernel::LiteralOrdering<Kernel::LAKBO>::compare(Kernel::Literal*,Kernel::Literal*)const::_lambda()_1_,Kernel::LiteralOrdering<Kernel::LAKBO>::compare(Kernel::Literal*,Kernel::Literal*)const::_lambda()_2_>
                        (in_stack_00000200,in_stack_00000218);
      goto LAB_005756a0;
    }
  }
  RVar1 = compareUninterpreted(this,local_a8,local_b0);
LAB_005756a0:
  ::Lib::
  OptionBase<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
  ::~OptionBase(&local_70);
  ::Lib::
  OptionBase<Kernel::MultiSet<std::tuple<Kernel::PolyNf,_unsigned_int,_Lib::Coproduct<Kernel::IntegerConstantType,_Kernel::RationalConstantType,_Kernel::RealConstantType,_std::tuple<>_>_>_>_>
  ::~OptionBase(&local_48);
  return RVar1;
}

Assistant:

Result compare(Literal* l1, Literal* l2) const override {
    auto atoms1 = atoms(l1);
    auto atoms2 = atoms(l2);
    if (!atoms1.isSome() && atoms2.isSome()) {
      return Ordering::GREATER;

    } else if (atoms1.isSome() && !atoms2.isSome()) {
      return Ordering::LESS;

    } else if (atoms1.isSome() && atoms2.isSome()) {
      return AlascaOrderingUtils::lexLazy(
            [&](){ return OrderingUtils::mulExt(*atoms1, *atoms2, [&](auto l, auto r) { return cmpAtom(l, r); }); },
            [&](){ return cmpPrec(l1, l2); }
            );

    } else {
      ASS(atoms1.isNone() && atoms2.isNone())
      return compareUninterpreted(l1,l2);
    }
  }